

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

char_type * __thiscall
booster::locale::gnu_gettext::mo_message<char>::get
          (mo_message<char> *this,int domain_id,char_type *context,char_type *single_id,int n)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  uint in_EAX;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  pair_type pVar8;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  pVar8 = get_string(this,domain_id,context,single_id);
  pcVar6 = pVar8.second;
  pcVar5 = pVar8.first;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    psVar1 = (this->plural_forms_).
             super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->plural_forms_).
                      super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)(long)domain_id) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    peVar2 = psVar1[domain_id].
             super___shared_ptr<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      uVar4 = (uint)(n != 1);
    }
    else {
      uVar4 = (**peVar2->_vptr_plural)(peVar2,(ulong)(uint)n);
    }
    bVar3 = (int)uVar4 < 1 || pcVar6 <= pcVar5;
    if ((int)uVar4 >= 1 && pcVar6 > pcVar5) {
      uStack_38 = (ulong)(uint)uStack_38;
      pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                         (pcVar5,pcVar6);
      if (pcVar5 != pcVar6) {
        iVar7 = 1;
        do {
          pcVar5 = pcVar5 + 1;
          bVar3 = (int)uVar4 <= iVar7 || pcVar6 <= pcVar5;
          if (bVar3) break;
          uStack_38 = uStack_38 & 0xffffffff;
          pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (pcVar5,pcVar6,(long)&uStack_38 + 4);
          iVar7 = iVar7 + 1;
        } while (pcVar5 != pcVar6);
      }
    }
    if (pcVar6 <= pcVar5) {
      pcVar5 = (char *)0x0;
    }
    if (!bVar3) {
      pcVar5 = (char *)0x0;
    }
  }
  return pcVar5;
}

Assistant:

virtual char_type const *get(int domain_id,char_type const *context,char_type const *single_id,int n) const
                {
                    pair_type ptr = get_string(domain_id,context,single_id);
                    if(!ptr.first)
                        return 0;
                    int form=0;
                    if(plural_forms_.at(domain_id)) 
                        form = (*plural_forms_[domain_id])(n);
                    else
                        form = n == 1 ? 0 : 1; // Fallback to english plural form

                    CharType const *p=ptr.first;
                    for(int i=0;p < ptr.second && i<form;i++) {
                        p=std::find(p,ptr.second,0);
                        if(p==ptr.second)
                            return 0;
                        ++p;
                    }
                    if(p>=ptr.second)
                        return 0;
                    return p;
                }